

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

void __thiscall jbcoin::STTx::STTx(STTx *this,STObject *object)

{
  atomic<int> *paVar1;
  bool bVar2;
  unsigned_short uVar3;
  Counter *pCVar4;
  Item *type;
  uint256 local_30;
  
  STObject::STObject(&this->super_STObject,object);
  pCVar4 = CountedObject<jbcoin::STTx>::getCounter();
  LOCK();
  paVar1 = &(pCVar4->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STTx_002f8348;
  (this->tid_).pn[0] = 0;
  (this->tid_).pn[1] = 0;
  (this->tid_).pn[2] = 0;
  (this->tid_).pn[3] = 0;
  (this->tid_).pn[4] = 0;
  (this->tid_).pn[5] = 0;
  (this->tid_).pn[6] = 0;
  (this->tid_).pn[7] = 0;
  uVar3 = STObject::getFieldByValue<jbcoin::STInteger<unsigned_short>,unsigned_short>
                    (&this->super_STObject,(SField *)&sfTransactionType);
  this->tx_type_ = (uint)uVar3;
  type = getTxFormat((uint)uVar3);
  bVar2 = STObject::setType(&this->super_STObject,&type->elements);
  if (bVar2) {
    STObject::getHash(&local_30,&this->super_STObject,HashPrefix::transactionID);
    base_uint<256UL,_void>::operator=(&this->tid_,&local_30);
    return;
  }
  Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"transaction not valid");
}

Assistant:

STTx::STTx (STObject&& object)
    : STObject (std::move (object))
{
    tx_type_ = static_cast <TxType> (getFieldU16 (sfTransactionType));

    if (!setType (getTxFormat (tx_type_)->elements))
        Throw<std::runtime_error> ("transaction not valid");

    tid_ = getHash(HashPrefix::transactionID);
}